

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

_Bool checkprotoprefix(SessionHandle *data,connectdata *conn,char *s)

{
  _Bool _Var1;
  int iVar2;
  
  if ((conn->handler->protocol & 0x40000) == 0) {
    _Var1 = checkhttpprefix(data,s);
    return _Var1;
  }
  iVar2 = Curl_raw_nequal("RTSP/",s,5);
  return iVar2 != 0;
}

Assistant:

static bool
checkprotoprefix(struct SessionHandle *data, struct connectdata *conn,
                 const char *s)
{
#ifndef CURL_DISABLE_RTSP
  if(conn->handler->protocol & CURLPROTO_RTSP)
    return checkrtspprefix(data, s);
#else
  (void)conn;
#endif /* CURL_DISABLE_RTSP */

  return checkhttpprefix(data, s);
}